

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O3

uint aom_highbd_8_obmc_variance16x64_sse4_1
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar19 [16];
  
  lVar4 = (long)pre * 2;
  auVar9 = pmovsxwd(in_XMM2,0x800080008000800);
  auVar8 = (undefined1  [16])0x0;
  uVar5 = 0;
  auVar7 = (undefined1  [16])0x0;
  do {
    auVar16 = pmovzxwd(in_XMM4,*(undefined8 *)(lVar4 + 8 + uVar5 * 2));
    piVar1 = wsrc + uVar5;
    auVar17 = pmovzxwd(in_XMM5,*(undefined8 *)(lVar4 + uVar5 * 2));
    in_XMM5 = pmaddwd(auVar17,*(undefined1 (*) [16])(mask + uVar5));
    piVar2 = wsrc + uVar5 + 4;
    iVar10 = *piVar1 - in_XMM5._0_4_;
    iVar13 = piVar1[1] - in_XMM5._4_4_;
    iVar14 = piVar1[2] - in_XMM5._8_4_;
    iVar15 = piVar1[3] - in_XMM5._12_4_;
    auVar16 = pmaddwd(auVar16,*(undefined1 (*) [16])(mask + uVar5 + 4));
    iVar18 = *piVar2 - auVar16._0_4_;
    iVar20 = piVar2[1] - auVar16._4_4_;
    iVar21 = piVar2[2] - auVar16._8_4_;
    iVar22 = piVar2[3] - auVar16._12_4_;
    auVar17._0_4_ = iVar10 + auVar9._0_4_ + (iVar10 >> 0x1f) >> 0xc;
    auVar17._4_4_ = iVar13 + auVar9._4_4_ + (iVar13 >> 0x1f) >> 0xc;
    auVar17._8_4_ = iVar14 + auVar9._8_4_ + (iVar14 >> 0x1f) >> 0xc;
    auVar17._12_4_ = iVar15 + auVar9._12_4_ + (iVar15 >> 0x1f) >> 0xc;
    in_XMM4._0_4_ = iVar18 >> 0x1f;
    in_XMM4._4_4_ = iVar20 >> 0x1f;
    in_XMM4._8_4_ = iVar21 >> 0x1f;
    in_XMM4._12_4_ = iVar22 >> 0x1f;
    auVar19._0_4_ = iVar18 + auVar9._0_4_ + in_XMM4._0_4_ >> 0xc;
    auVar19._4_4_ = iVar20 + auVar9._4_4_ + in_XMM4._4_4_ >> 0xc;
    auVar19._8_4_ = iVar21 + auVar9._8_4_ + in_XMM4._8_4_ >> 0xc;
    auVar19._12_4_ = iVar22 + auVar9._12_4_ + in_XMM4._12_4_ >> 0xc;
    iVar18 = auVar8._8_4_;
    iVar20 = auVar8._12_4_;
    auVar16 = packssdw(auVar17,auVar19);
    auVar11 = pmaddwd(auVar16,auVar16);
    iVar10 = auVar7._0_4_ + auVar11._0_4_;
    iVar13 = auVar7._4_4_ + auVar11._4_4_;
    auVar16._0_8_ = CONCAT44(iVar13,iVar10);
    auVar16._8_4_ = auVar7._8_4_ + auVar11._8_4_;
    auVar16._12_4_ = auVar7._12_4_ + auVar11._12_4_;
    iVar14 = auVar8._0_4_ + auVar17._0_4_ + auVar19._0_4_;
    iVar15 = auVar8._4_4_ + auVar17._4_4_ + auVar19._4_4_;
    auVar8._0_8_ = CONCAT44(iVar15,iVar14);
    auVar8._8_4_ = iVar18 + auVar17._8_4_ + auVar19._8_4_;
    auVar8._12_4_ = iVar20 + auVar17._12_4_ + auVar19._12_4_;
    lVar4 = lVar4 + ((long)(uVar5 << 0x3c) >> 0x3f & (long)(pre_stride + -0x10)) * 2;
    bVar6 = uVar5 < 0x3f8;
    uVar5 = uVar5 + 8;
    auVar7 = auVar16;
  } while (bVar6);
  auVar11._8_4_ = iVar15;
  auVar11._0_8_ = auVar8._0_8_;
  auVar11._12_4_ = iVar15 >> 0x1f;
  auVar9._0_8_ = (long)auVar8._8_4_;
  auVar9._8_4_ = auVar8._12_4_;
  auVar9._12_4_ = auVar8._12_4_ >> 0x1f;
  auVar12._8_4_ = iVar13;
  auVar12._0_8_ = auVar16._0_8_;
  auVar12._12_4_ = iVar13 >> 0x1f;
  auVar7._0_8_ = (long)auVar16._8_4_;
  auVar7._8_4_ = auVar16._12_4_;
  auVar7._12_4_ = auVar16._12_4_ >> 0x1f;
  uVar3 = (int)(auVar7._8_8_ + auVar12._8_8_) + auVar16._8_4_ + iVar10;
  *sse = uVar3;
  lVar4 = (long)((int)(auVar9._8_8_ + auVar11._8_8_) + auVar8._8_4_ + iVar14);
  return uVar3 - (int)((ulong)(lVar4 * lVar4) >> 10);
}

Assistant:

static inline void highbd_8_obmc_variance(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          unsigned int *sse, int *sum) {
  int64_t sum64 = 0;
  uint64_t sse64 = 0;
  if (w == 4) {
    hbd_obmc_variance_w4(pre8, pre_stride, wsrc, mask, &sse64, &sum64, h);
  } else {
    hbd_obmc_variance_w8n(pre8, pre_stride, wsrc, mask, &sse64, &sum64, w, h);
  }
  *sum = (int)sum64;
  *sse = (unsigned int)sse64;
}